

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_zero_lattice_digital_filter.cc
# Opt level: O0

bool __thiscall
sptk::AllZeroLatticeDigitalFilter::Run
          (AllZeroLatticeDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  long in_RCX;
  double *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  value_type in_XMM0_Qa;
  double dVar5;
  double tmp;
  int m;
  double next_d;
  double sum;
  double *d;
  double *k;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  value_type local_68;
  double local_60;
  
  if (((((*(byte *)((long)in_RDI._M_current + 0xc) & 1) == 0) ||
       (sVar2 = ::std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar2 != (long)(*(int *)(in_RDI._M_current + 1) + 1))) || (in_RDX == (double *)0x0)) ||
     (in_RCX == 0)) {
    return false;
  }
  sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
  if (sVar2 != (long)*(int *)(in_RDI._M_current + 1)) {
    ::std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
    ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
    ::std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_RDI,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  if (*(int *)(in_RDI._M_current + 1) == 0) {
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    *in_RDX = in_XMM0_Qa * *pvVar3;
    return true;
  }
  pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
  pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),0);
  local_68 = in_XMM0_Qa;
  local_60 = in_XMM0_Qa;
  for (iVar6 = 0; iVar6 < *(int *)(in_RDI._M_current + 1); iVar6 = iVar6 + 1) {
    dVar1 = pvVar4[iVar6];
    dVar5 = pvVar3[iVar6] * local_60;
    local_60 = pvVar3[iVar6] * pvVar4[iVar6] + local_60;
    pvVar4[iVar6] = local_68;
    local_68 = dVar5 + dVar1;
  }
  pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  *in_RDX = local_60 * *pvVar3;
  return true;
}

Assistant:

bool AllZeroLatticeDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, AllZeroLatticeDigitalFilter::Buffer* buffer) const {
  // Check inputs
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  if (0 == num_filter_order_) {
    *filter_output = filter_input * filter_coefficients[0];
    return true;
  }

  const double* k(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(filter_input);
  double next_d(filter_input);

  // Apply all-zero lattice filter.
  for (int m(0); m < num_filter_order_; ++m) {
    const double tmp(d[m] + k[m] * sum);
    sum += k[m] * d[m];
    d[m] = next_d;
    next_d = tmp;
  }

  // Save result.
  *filter_output = sum * filter_coefficients[0];

  return true;
}